

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::ParseVarintTest_Varint64_Test::TestBody::anon_class_1_0_00000001::
operator()(anon_class_1_0_00000001 *this,uint64_t value,int varint_length)

{
  bool bVar1;
  int i;
  long lVar2;
  byte *pbVar3;
  anon_class_1_0_00000001 *paVar4;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var5;
  char *pcVar6;
  pair<const_char_*,_unsigned_long> pVar7;
  uint8_t buffer [10];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  internal local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_40;
  AssertHelper local_38;
  int local_2c;
  byte local_28 [16];
  anon_class_1_0_00000001 *local_18;
  
  local_2c = (int)value;
  local_28[8] = 0;
  local_28[9] = 0;
  local_28[0] = 0;
  local_28[1] = 0;
  local_28[2] = 0;
  local_28[3] = 0;
  local_28[4] = 0;
  local_28[5] = 0;
  local_28[6] = 0;
  local_28[7] = 0;
  pbVar3 = local_28;
  local_18 = this;
  if ((anon_class_1_0_00000001 *)0x7f < this) {
    pbVar3 = local_28;
    paVar4 = this;
    do {
      *pbVar3 = (byte)paVar4 | 0x80;
      this = (anon_class_1_0_00000001 *)((ulong)paVar4 >> 7);
      pbVar3 = pbVar3 + 1;
      bVar1 = (anon_class_1_0_00000001 *)0x3fff < paVar4;
      paVar4 = this;
    } while (bVar1);
  }
  *pbVar3 = (byte)this;
  local_40._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (pbVar3 + (1 - (long)local_28));
  testing::internal::CmpHelperEQ<long,int>
            (local_50,"p - buffer","varint_length",(long *)&local_40,&local_2c);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_40._M_head_impl + 0x10),"Value = ",8);
    std::ostream::_M_insert<unsigned_long>((ulong)(local_40._M_head_impl + 0x10));
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x8d,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    _Var5._M_head_impl = local_40._M_head_impl;
  }
  else {
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
    lVar2 = 0;
    do {
      lVar2 = lVar2 + 1;
    } while (lVar2 != 10);
    if ((long)(char)local_28[0] < 0) {
      pVar7 = internal::VarintParseSlow64((char *)local_28,(uint)local_28[0]);
    }
    else {
      pVar7.second = (long)(char)local_28[0];
      pVar7.first = (char *)(local_28 + 1);
    }
    local_40._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)pVar7.second;
    local_58._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (pVar7.first + -(long)local_28);
    testing::internal::CmpHelperEQ<long,int>
              (local_50,"r - cbuffer","varint_length",(long *)&local_58,&local_2c);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_58);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_58._M_head_impl + 0x10),"Value = ",8);
      std::ostream::_M_insert<unsigned_long>((ulong)(local_58._M_head_impl + 0x10));
      if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = (local_48->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
                 ,0x92,pcVar6);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_58);
    }
    else {
      if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_48,local_48);
      }
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                (local_50,"parsed","value",(unsigned_long *)&local_40,(unsigned_long *)&local_18);
      if (local_50[0] != (internal)0x0) goto LAB_00167c58;
      testing::Message::Message((Message *)&local_58);
      if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = (local_48->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
                 ,0x93,pcVar6);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_58);
    }
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    _Var5._M_head_impl = local_58._M_head_impl;
  }
  if (_Var5._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)_Var5._M_head_impl + 8))();
  }
LAB_00167c58:
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  return;
}

Assistant:

TEST(ParseVarintTest, Varint64) {
  auto test_value = [](uint64_t value, int varint_length) {
    uint8_t buffer[10] = {0};
    uint8_t* p = io::CodedOutputStream::WriteVarint64ToArray(value, buffer);
    ASSERT_EQ(p - buffer, varint_length) << "Value = " << value;

    const char* cbuffer = reinterpret_cast<const char*>(buffer);
    uint64_t parsed = ~value;
    const char* r = internal::VarintParse(cbuffer, &parsed);
    ASSERT_EQ(r - cbuffer, varint_length) << "Value = " << value;
    ASSERT_EQ(parsed, value);
  };

  uint64_t base = 73;  // 1001011b
  for (int varint_length = 1; varint_length <= 10; ++varint_length) {
    uint64_t values[] = {
        base - 73, base - 72, base, base + 126 - 73, base + 126 - 72,
    };
    for (uint64_t value : values) {
      test_value(value, varint_length);
    }
    base = (base << 7) + 73;
  }

  test_value(std::numeric_limits<uint64_t>::max(), 10);
}